

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode cr_lc_read(Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *pnread,
                   _Bool *peos)

{
  char *buf_00;
  void *pvVar1;
  curl_trc_feat *pcVar2;
  _Bool _Var3;
  CURLcode CVar4;
  void *pvVar5;
  bufq *q;
  ulong uVar6;
  byte bVar7;
  size_t len;
  size_t sVar8;
  _Bool eos;
  Curl_easy *local_68;
  _Bool *local_60;
  size_t local_58;
  bufq *local_50;
  size_t n;
  size_t nread;
  ulong local_38;
  
  pvVar1 = reader->ctx;
  if ((*(byte *)((long)pvVar1 + 0x60) & 2) != 0) {
    *pnread = 0;
    *peos = true;
    return CURLE_OK;
  }
  q = (bufq *)((long)pvVar1 + 0x20);
  local_68 = data;
  local_60 = peos;
  local_58 = blen;
  _Var3 = Curl_bufq_is_empty(q);
  if (_Var3) {
    if ((*(byte *)((long)pvVar1 + 0x60) & 1) != 0) {
      *(byte *)((long)pvVar1 + 0x60) = *(byte *)((long)pvVar1 + 0x60) | 2;
      *pnread = 0;
      *local_60 = true;
      return CURLE_OK;
    }
    local_50 = q;
    CVar4 = Curl_creader_read(local_68,reader->next,buf,local_58,&nread,&eos);
    sVar8 = nread;
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    bVar7 = *(byte *)((long)pvVar1 + 0x60) & 0xfe | eos;
    *(byte *)((long)pvVar1 + 0x60) = bVar7;
    if ((nread != 0) && (pvVar5 = memchr(buf,10,nread), pvVar5 != (void *)0x0)) {
      uVar6 = 0;
      do {
        q = local_50;
        buf_00 = buf + uVar6;
        len = 0;
        while( true ) {
          if (sVar8 <= uVar6 + len) {
            if ((uVar6 < uVar6 + len) &&
               (CVar4 = Curl_bufq_cwrite(local_50,buf_00,len,&n), CVar4 != CURLE_OK)) {
              return CVar4;
            }
            goto LAB_0014df29;
          }
          if ((buf_00[len] == '\n') && ((*(byte *)((long)pvVar1 + 0x60) & 4) == 0)) break;
          *(byte *)((long)pvVar1 + 0x60) =
               *(byte *)((long)pvVar1 + 0x60) & 0xfb | (buf_00[len] == '\r') << 2;
          len = len + 1;
        }
        local_38 = uVar6;
        CVar4 = Curl_bufq_cwrite(local_50,buf_00,len,&n);
        if (CVar4 != CURLE_OK) {
          return CVar4;
        }
        CVar4 = Curl_bufq_cwrite(local_50,"\r\n",2,&n);
        if (CVar4 != CURLE_OK) {
          return CVar4;
        }
        uVar6 = local_38 + len + 1;
        sVar8 = nread;
      } while( true );
    }
    if (eos != false) {
      *(byte *)((long)pvVar1 + 0x60) = bVar7 | 2;
    }
    *pnread = sVar8;
    _Var3 = (_Bool)(*(byte *)((long)pvVar1 + 0x60) >> 1 & 1);
    sVar8 = local_58;
  }
  else {
LAB_0014df29:
    sVar8 = local_58;
    *local_60 = false;
    CVar4 = Curl_bufq_cread(q,buf,local_58,pnread);
    uVar6 = (ulong)CVar4;
    if (((CVar4 != CURLE_OK) || (uVar6 = 0, (*(byte *)((long)pvVar1 + 0x60) & 1) == 0)) ||
       (_Var3 = Curl_bufq_is_empty(q), !_Var3)) goto LAB_0014df7f;
    *(byte *)((long)pvVar1 + 0x60) = *(byte *)((long)pvVar1 + 0x60) | 2;
    _Var3 = true;
  }
  *local_60 = _Var3;
  uVar6 = 0;
LAB_0014df7f:
  if ((((local_68 != (Curl_easy *)0x0) && (((local_68->set).field_0x897 & 0x40) != 0)) &&
      ((pcVar2 = (local_68->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))
      ) && (0 < Curl_trc_feat_read.log_level)) {
    Curl_trc_read(local_68,"cr_lc_read(len=%zu) -> %d, nread=%zu, eos=%d",sVar8,uVar6,*pnread,
                  (ulong)*local_60);
  }
  return (CURLcode)uVar6;
}

Assistant:

static CURLcode cr_lc_read(struct Curl_easy *data,
                           struct Curl_creader *reader,
                           char *buf, size_t blen,
                           size_t *pnread, bool *peos)
{
  struct cr_lc_ctx *ctx = reader->ctx;
  CURLcode result;
  size_t nread, i, start, n;
  bool eos;

  if(ctx->eos) {
    *pnread = 0;
    *peos = TRUE;
    return CURLE_OK;
  }

  if(Curl_bufq_is_empty(&ctx->buf)) {
    if(ctx->read_eos) {
      ctx->eos = TRUE;
      *pnread = 0;
      *peos = TRUE;
      return CURLE_OK;
    }
    /* Still getting data form the next reader, ctx->buf is empty */
    result = Curl_creader_read(data, reader->next, buf, blen, &nread, &eos);
    if(result)
      return result;
    ctx->read_eos = eos;

    if(!nread || !memchr(buf, '\n', nread)) {
      /* nothing to convert, return this right away */
      if(ctx->read_eos)
        ctx->eos = TRUE;
      *pnread = nread;
      *peos = ctx->eos;
      goto out;
    }

    /* at least one \n might need conversion to '\r\n', place into ctx->buf */
    for(i = start = 0; i < nread; ++i) {
      /* if this byte is not an LF character, or if the preceding character is
         a CR (meaning this already is a CRLF pair), go to next */
      if((buf[i] != '\n') || ctx->prev_cr) {
        ctx->prev_cr = (buf[i] == '\r');
        continue;
      }
      ctx->prev_cr = FALSE;
      /* on a soft limit bufq, we do not need to check length */
      result = Curl_bufq_cwrite(&ctx->buf, buf + start, i - start, &n);
      if(!result)
        result = Curl_bufq_cwrite(&ctx->buf, STRCONST("\r\n"), &n);
      if(result)
        return result;
      start = i + 1;
    }

    if(start < i) { /* leftover */
      result = Curl_bufq_cwrite(&ctx->buf, buf + start, i - start, &n);
      if(result)
        return result;
    }
  }

  DEBUGASSERT(!Curl_bufq_is_empty(&ctx->buf));
  *peos = FALSE;
  result = Curl_bufq_cread(&ctx->buf, buf, blen, pnread);
  if(!result && ctx->read_eos && Curl_bufq_is_empty(&ctx->buf)) {
    /* no more data, read all, done. */
    ctx->eos = TRUE;
    *peos = TRUE;
  }

out:
  CURL_TRC_READ(data, "cr_lc_read(len=%zu) -> %d, nread=%zu, eos=%d",
                blen, result, *pnread, *peos);
  return result;
}